

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetCMakePropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetCMakePropertyCommand::InitialPass
          (cmGetCMakePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  cmGlobalGenerator *pcVar4;
  cmState *this_00;
  ulong uVar5;
  string output;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  if (uVar5 < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"called with incorrect number of arguments",
               (allocator<char> *)&local_40);
    cmCommand::SetError(&this->super_cmCommand,&local_60);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"NOTFOUND",(allocator<char> *)&local_40);
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"VARIABLES");
    if (bVar2) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"VARIABLES",&local_61);
      pcVar3 = cmMakefile::GetProperty(pcVar1,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&local_60);
      }
    }
    else {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1,"MACROS");
      if (bVar2) {
        local_60._M_string_length = 0;
        *local_60._M_dataplus._M_p = '\0';
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"MACROS",&local_61);
        pcVar3 = cmMakefile::GetProperty(pcVar1,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        if (pcVar3 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&local_60);
        }
      }
      else {
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1,"COMPONENTS");
        if (bVar2) {
          pcVar4 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_40,&pcVar4->InstallComponents,";");
          std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
        else if ((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length != 0) {
          this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pcVar3 = cmState::GetGlobalProperty
                             (this_00,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1);
          if (pcVar3 != (char *)0x0) {
            std::__cxx11::string::assign((char *)&local_60);
          }
        }
      }
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,local_60._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return 0x20 < uVar5;
}

Assistant:

bool cmGetCMakePropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& variable = args[0];
  std::string output = "NOTFOUND";

  if (args[1] == "VARIABLES") {
    if (const char* varsProp = this->Makefile->GetProperty("VARIABLES")) {
      output = varsProp;
    }
  } else if (args[1] == "MACROS") {
    output.clear();
    if (const char* macrosProp = this->Makefile->GetProperty("MACROS")) {
      output = macrosProp;
    }
  } else if (args[1] == "COMPONENTS") {
    const std::set<std::string>* components =
      this->Makefile->GetGlobalGenerator()->GetInstallComponents();
    output = cmJoin(*components, ";");
  } else {
    const char* prop = nullptr;
    if (!args[1].empty()) {
      prop = this->Makefile->GetState()->GetGlobalProperty(args[1]);
    }
    if (prop) {
      output = prop;
    }
  }

  this->Makefile->AddDefinition(variable, output.c_str());

  return true;
}